

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdrive.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  singlecomplex *psVar5;
  singlecomplex *psVar6;
  int *piVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  int *piVar12;
  yes_no_t yVar13;
  FILE *unaff_RBX;
  ulong uVar14;
  fact_t fVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  trans_t tVar19;
  long lVar20;
  uint uVar21;
  bool bVar22;
  int n;
  int m;
  uint local_478;
  char local_471;
  int_t info;
  uint local_46c;
  int *local_468;
  int_t nnz;
  float colcnd;
  float rowcnd;
  ulong local_450;
  int local_448;
  int lda;
  ulong local_440;
  ulong local_438;
  superlu_options_t *local_430;
  trans_t local_424;
  ulong local_420;
  float *local_418;
  float *local_410;
  int *local_408;
  singlecomplex *local_400;
  int local_3f8;
  int local_3f4;
  int local_3f0;
  yes_no_t local_3ec;
  int local_3e8;
  yes_no_t local_3e4;
  int ku;
  int kl;
  float amax;
  int info1;
  singlecomplex *local_3d0;
  int *local_3c8;
  void *local_3c0;
  float *local_3b8;
  float *local_3b0;
  singlecomplex *local_3a8;
  singlecomplex *local_3a0;
  singlecomplex *local_398;
  int_t *xa;
  int_t *asub;
  singlecomplex *a;
  float *local_378;
  long local_370;
  int *local_368;
  fact_t local_35c;
  float cndnum;
  float anorm;
  int mode;
  float rcond;
  float result [5];
  singlecomplex *local_330;
  int_t *xa_save;
  int_t *asub_save;
  singlecomplex *a_save;
  long local_310;
  long local_308;
  long local_300;
  SuperMatrix U;
  SuperMatrix L;
  float rpg;
  mem_usage_t mem_usage;
  SuperMatrix ASAV;
  SuperMatrix A;
  int iseed [4];
  SuperLUStat_t stat;
  SuperMatrix X;
  SuperMatrix B;
  superlu_options_t options;
  SuperMatrix AC;
  GlobalLU_t Glu;
  
  iseed[0] = 0x7c4;
  iseed[1] = 0x7c5;
  iseed[2] = 0x7c6;
  iseed[3] = 0x7c7;
  builtin_strncpy(main::path,"CGE",4);
  n = 1;
  local_478 = 1;
  local_3f0 = sp_ienv(1);
  local_3f4 = sp_ienv(2);
  main::matrix_type[0] = 'L';
  main::matrix_type[1] = 'A';
  main::matrix_type[2] = '\0';
  local_468 = (int *)0x3ff0000000000000;
  local_420 = 0;
  do {
    iVar3 = getopt(argc,argv,"ht:n:w:r:s:m:b:c:l:u:f:");
    switch(iVar3) {
    case 0x66:
      unaff_RBX = fopen(_optarg,"r");
      if (unaff_RBX == (FILE *)0x0) {
        sprintf((char *)&Glu,"%s at line %d in file %s\n","File does not exist",0x239,
                "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/TESTING/cdrive.c"
               );
        superlu_abort_and_exit((char *)&Glu);
      }
      printf(".. test sparse matrix in file: %s\n",_optarg);
      break;
    case 0x67:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6d:
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x76:
      break;
    case 0x68:
      puts("Options:");
      puts("\t-w <int> - panel size");
      puts("\t-r <int> - granularity of relaxed supernodes");
      iVar3 = 1;
LAB_00102804:
      exit(iVar3);
    case 0x6c:
      iVar3 = atoi(_optarg);
      local_420 = CONCAT44(extraout_var,iVar3);
      break;
    case 0x6e:
      n = atoi(_optarg);
      break;
    case 0x72:
      local_3f4 = atoi(_optarg);
      break;
    case 0x73:
      local_478 = atoi(_optarg);
      break;
    case 0x74:
      strcpy(main::matrix_type,_optarg);
      break;
    case 0x75:
      local_468 = (int *)atof(_optarg);
      break;
    case 0x77:
      local_3f0 = atoi(_optarg);
      break;
    default:
      if (iVar3 == -1) {
        if ((int)local_420 < 1) {
          local_3c0 = (void *)0x0;
        }
        else {
          uVar14 = local_420 & 0xffffffff;
          local_3c0 = superlu_malloc(uVar14);
          if (local_3c0 == (void *)0x0) {
            fprintf(_stderr,"expert: cannot allocate %lld bytes\n",uVar14);
            iVar3 = -1;
            goto LAB_00102804;
          }
        }
        uVar2 = local_478;
        set_default_options(&options);
        options.DiagPivotThresh = (double)local_468;
        options.PrintStat = NO;
        options.PivotGrowth = YES;
        options.ConditionNumber = YES;
        options.IterRefine = SLU_SINGLE;
        iVar3 = bcmp(main::matrix_type,"LA",3);
        local_478 = uVar2;
        if (iVar3 == 0) {
          m = n;
          uVar21 = 1;
          lda = 1;
          if (1 < n) {
            lda = n;
          }
          nnz = n * n;
          local_330 = singlecomplexCalloc((long)(lda * n));
          callocateA(n,nnz,&a,&asub,&xa);
          local_3f8 = 0xb;
        }
        else {
          creadhb((FILE *)unaff_RBX,&m,&n,&nnz,&a,&asub,&xa);
          uVar21 = 0;
          local_3f8 = 0;
        }
        callocateA(n,nnz,&a_save,&asub_save,&xa_save);
        lVar20 = (long)(int)uVar2;
        psVar5 = singlecomplexMalloc(m * lVar20);
        local_3a0 = singlecomplexMalloc(m * lVar20);
        psVar6 = singlecomplexMalloc(n * lVar20);
        local_3a8 = singlecomplexMalloc(n * lVar20);
        iVar3 = n;
        if (n < m) {
          iVar3 = m;
        }
        uVar11 = 4;
        if (4 < (int)uVar2) {
          uVar11 = uVar2;
        }
        local_3d0 = singlecomplexCalloc((long)(int)(iVar3 * uVar11));
        iVar3 = n;
        local_440 = (ulong)(uint)m;
        uVar14 = (ulong)(uint)n;
        local_398 = psVar5;
        cCreate_Dense_Matrix(&B,m,uVar2,psVar5,m,SLU_DN,SLU_C,SLU_GE);
        local_438 = uVar14;
        local_400 = psVar6;
        cCreate_Dense_Matrix(&X,n,uVar2,psVar6,iVar3,SLU_DN,SLU_C,SLU_GE);
        local_368 = int32Malloc(n);
        local_408 = int32Malloc(n);
        local_468 = int32Malloc(n);
        piVar7 = int32Malloc(n);
        local_410 = (float *)superlu_malloc((long)m << 2);
        local_418 = (float *)superlu_malloc((long)n << 2);
        local_3b0 = (float *)superlu_malloc(lVar20 << 2);
        local_3b8 = (float *)superlu_malloc(lVar20 << 2);
        iVar3 = n;
        if (n < m) {
          iVar3 = m;
        }
        uVar11 = iVar3 * uVar11;
        local_378 = (float *)superlu_malloc((long)(int)uVar11 * 4);
        uVar10 = 0;
        uVar14 = (ulong)uVar11;
        if ((int)uVar11 < 1) {
          uVar14 = uVar10;
        }
        for (; uVar14 != uVar10; uVar10 = uVar10 + 1) {
          local_378[uVar10] = 0.0;
        }
        local_3c8 = piVar7;
        if (local_410 == (float *)0x0) {
          sprintf((char *)&Glu,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for R",0xc2,
                  "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/TESTING/cdrive.c"
                 );
          superlu_abort_and_exit((char *)&Glu);
        }
        if (local_418 == (float *)0x0) {
          sprintf((char *)&Glu,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for C",0xc3,
                  "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/TESTING/cdrive.c"
                 );
          superlu_abort_and_exit((char *)&Glu);
        }
        if (local_3b0 == (float *)0x0) {
          sprintf((char *)&Glu,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for ferr",0xc4,
                  "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/TESTING/cdrive.c"
                 );
          superlu_abort_and_exit((char *)&Glu);
        }
        if (local_3b8 == (float *)0x0) {
          sprintf((char *)&Glu,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for berr",0xc5,
                  "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/TESTING/cdrive.c"
                 );
          superlu_abort_and_exit((char *)&Glu);
        }
        if (local_378 == (float *)0x0) {
          sprintf((char *)&Glu,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for rwork",0xc6,
                  "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/TESTING/cdrive.c"
                 );
          superlu_abort_and_exit((char *)&Glu);
        }
        for (lVar20 = 0; lVar20 < n; lVar20 = lVar20 + 1) {
          piVar7[lVar20] = (int)lVar20;
          local_468[lVar20] = (int)lVar20;
        }
        local_430 = &options;
        options.ColPerm = MY_PERMC;
        local_448 = 0;
        uVar14 = 0;
        uVar16 = local_438;
        uVar10 = local_420;
        local_46c = uVar21;
        do {
          if (local_3f8 < (int)local_46c) {
            PrintSumm("CGE",(int)uVar14,local_448,0);
            iVar3 = bcmp(main::matrix_type,"LA",3);
            if (iVar3 == 0) {
              superlu_free(local_330);
            }
            superlu_free(local_398);
            superlu_free(local_3a0);
            superlu_free(local_400);
            superlu_free(local_3a8);
            superlu_free(local_368);
            superlu_free(local_408);
            superlu_free(local_468);
            superlu_free(local_3c8);
            superlu_free(local_410);
            superlu_free(local_418);
            superlu_free(local_3b0);
            superlu_free(local_3b8);
            superlu_free(local_378);
            superlu_free(local_3d0);
            Destroy_SuperMatrix_Store(&B);
            Destroy_SuperMatrix_Store(&X);
            superlu_free(a);
            superlu_free(asub);
            superlu_free(xa);
            superlu_free(a_save);
            superlu_free(asub_save);
            superlu_free(xa_save);
            if (0 < (int)uVar10) {
              superlu_free(local_3c0);
              Destroy_SuperMatrix_Store(&L);
              Destroy_SuperMatrix_Store(&U);
            }
            return (int)((int)uVar14 != 0);
          }
          if (local_46c == 0) {
            local_430 = (superlu_options_t *)(ulong)(n + 1);
            local_471 = '\x01';
LAB_00101b78:
            cCreate_CompCol_Matrix(&A,m,n,nnz,a,asub,xa,SLU_NC,SLU_C,SLU_GE);
            cCreate_CompCol_Matrix(&ASAV,m,n,nnz,a_save,asub_save,xa_save,SLU_NC,SLU_C,SLU_GE);
            cCopy_CompCol_Matrix(&A,&ASAV);
            cGenXtrue(n,local_478,local_3a8,(int)uVar16);
            StatInit(&stat);
            local_3e8 = (int)local_430 + -1;
            lVar20 = 0;
            while (lVar20 != 4) {
              main::equed[0] = "NRCB"[lVar20];
              local_310 = (ulong)(lVar20 == 0) * 3 + 1;
              lVar8 = 0;
              local_370 = lVar20;
              while (lVar8 != local_310) {
                options.Fact = main::facts[lVar8];
                yVar13 = NO;
                local_308 = lVar8;
                while (yVar13 != 2) {
                  fVar15 = options.Fact & ~SamePattern;
                  options.Equil = yVar13;
                  cCopy_CompCol_Matrix(&ASAV,&A);
                  local_3ec = yVar13;
                  local_35c = fVar15;
                  if (local_471 == '\0') {
                    if (fVar15 != SamePattern_SameRowPerm) {
                      local_3e4 = yVar13 | (yes_no_t)local_370;
                      goto LAB_00101ecd;
                    }
                  }
                  else {
                    local_3e4 = yVar13 | (yes_no_t)local_370;
                    if ((local_3e4 != NO) && (options.Fact == FACTORED)) {
                      cgsequ(&A,local_410,local_418,&rowcnd,&colcnd,&amax,&info1);
                      if ((info == 0) && (0 < n)) {
                        if (main::equed[0] == 'B') {
                          rowcnd = 0.0;
                        }
                        else {
                          if (main::equed[0] != 'C') {
                            if (main::equed[0] == 'R') {
                              rowcnd = 0.0;
                              colcnd = 1.0;
                            }
                            goto LAB_00101db0;
                          }
                          rowcnd = 1.0;
                        }
                        colcnd = 0.0;
                      }
LAB_00101db0:
                      claqgs(&A,local_410,local_418,rowcnd,colcnd,amax,main::equed);
                    }
                    piVar12 = local_368;
                    piVar7 = local_468;
                    if (fVar15 == SamePattern_SameRowPerm) {
                      local_450 = CONCAT44(local_450._4_4_,options.Fact);
                      options.Fact = DOFACT;
                      sp_preorder(&options,&A,local_468,local_368,&AC);
                      cgstrf(&options,&AC,local_3f4,local_3f0,piVar12,local_3c0,(int)uVar10,piVar7,
                             local_408,&L,&U,&Glu,&stat,&info);
                      if (((long)info != 0) &&
                         (printf("** First factor: info %lld, equed %c\n",(long)info,
                                 (ulong)(uint)(int)main::equed[0]), (int)uVar10 == -1)) {
                        printf("** Estimated memory: %lld bytes\n",(long)info - (long)n);
LAB_00102625:
                        exit(0);
                      }
                      Destroy_CompCol_Permuted(&AC);
                      options.Fact = (fact_t)local_450;
                    }
LAB_00101ecd:
                    lVar20 = 0;
                    while (uVar16 = local_440, lVar20 != 2) {
                      tVar19 = main::transs[lVar20];
                      local_450 = uVar14;
                      options.Trans = tVar19;
                      cCopy_CompCol_Matrix(&ASAV,&A);
                      uVar2 = local_478;
                      iVar17 = (int)local_438;
                      local_424 = tVar19;
                      cFillRHS(tVar19,local_478,local_3a8,iVar17,&A,&B);
                      iVar3 = (int)uVar16;
                      cCopy_Dense_Matrix(m,uVar2,local_398,iVar3,local_3a0,iVar3);
                      uVar14 = local_450;
                      tVar19 = local_424;
                      local_300 = lVar20;
                      if ((int)lVar20 == 0 && options.Fact == DOFACT) {
                        cCopy_Dense_Matrix(m,uVar2,local_398,iVar3,local_400,iVar17);
                        cgssv(&options,&A,local_468,local_408,&L,&U,&X,&stat,&info);
                        uVar14 = local_450;
                        iVar3 = (int)local_430;
                        if ((info == 0) || (info == iVar3)) {
                          cgst01(m,local_3e8,&A,&L,&U,local_468,local_408,result);
                          psVar5 = local_3d0;
                          tVar19 = local_424;
                          uVar2 = local_478;
                          uVar10 = 1;
                          if (iVar3 == n + 1) {
                            iVar3 = (int)local_440;
                            cCopy_Dense_Matrix(m,local_478,local_398,iVar3,local_3d0,iVar3);
                            cgst02(tVar19,m,n,uVar2,&A,local_400,(int)local_438,psVar5,iVar3,
                                   result + 1);
                            uVar10 = 2;
                          }
                          piVar7 = local_3c8;
                          piVar12 = local_468;
                          uVar14 = local_450;
                          for (uVar16 = 0; uVar10 != uVar16; uVar16 = uVar16 + 1) {
                            if (20.0 <= result[uVar16]) {
                              printf("%10s:n=%d, test(%d)=%12.5g\n",SUB84((double)result[uVar16],0),
                                     "cgssv",(ulong)(uint)n,uVar16 & 0xffffffff);
                              uVar14 = (ulong)((int)uVar14 + 1);
                              piVar12 = local_468;
                            }
                          }
                          local_448 = (int)uVar10 + local_448;
                          uVar10 = local_420;
                        }
                        else {
                          printf("%10s:info=%d, izero=%d, n=%d, nrhs=%d, imat=%d, nfail=%d\n",
                                 "cgssv",(ulong)(uint)info,(ulong)local_430 & 0xffffffff,
                                 (ulong)(uint)n,(ulong)local_478,(ulong)local_46c,local_450);
                          piVar12 = local_468;
                          piVar7 = local_3c8;
                          tVar19 = local_424;
                        }
                        for (lVar20 = 0; lVar20 < n; lVar20 = lVar20 + 1) {
                          piVar12[lVar20] = piVar7[lVar20];
                        }
                        if ((int)uVar10 == 0) {
                          Destroy_SuperNode_Matrix(&L);
                          Destroy_CompCol_Matrix(&U);
                        }
                      }
                      if (((options.Fact == FACTORED) && (local_3e4 != NO)) && (0 < n)) {
                        claqgs(&A,local_410,local_418,rowcnd,colcnd,amax,main::equed);
                      }
                      cgssvx(&options,&A,local_468,local_408,local_368,main::equed,local_410,
                             local_418,&L,&U,local_3c0,(int)uVar10,&B,&X,&rpg,&rcond,local_3b0,
                             local_3b8,&Glu,&mem_usage,&stat,&info);
                      if ((info == 0) || (info == (int)local_430)) {
                        bVar22 = local_35c != SamePattern_SameRowPerm;
                        if (bVar22) {
                          cgst01(m,local_3e8,&A,&L,&U,local_468,local_408,result);
                        }
                        psVar5 = local_3d0;
                        uVar2 = local_478;
                        uVar16 = (ulong)!bVar22;
                        if (info == 0) {
                          iVar3 = (int)local_440;
                          cCopy_Dense_Matrix(m,local_478,local_3a0,iVar3,local_3d0,iVar3);
                          psVar6 = local_400;
                          iVar17 = (int)local_438;
                          local_450 = uVar14;
                          cgst02(tVar19,m,n,uVar2,&ASAV,local_400,iVar17,psVar5,iVar3,result + 1);
                          psVar5 = local_3a8;
                          cgst04(n,uVar2,psVar6,iVar17,local_3a8,iVar17,rcond,result + 2);
                          uVar10 = local_420;
                          uVar14 = local_450;
                          cgst07(tVar19,n,uVar2,&ASAV,local_3a0,iVar3,local_400,iVar17,psVar5,iVar17
                                 ,local_3b0,local_3b8,result + 3);
                          for (; uVar16 != 5; uVar16 = uVar16 + 1) {
                            if (20.0 <= result[uVar16]) {
                              printf("%10s:fact=%4d, trans=%4d, equed=%c, n=%d, imat=%d, test(%d)=%12.5g\n"
                                     ,SUB84((double)result[uVar16],0),"cgssvx",(ulong)options.Fact,
                                     (ulong)tVar19,(ulong)(uint)(int)main::equed[0],(ulong)(uint)n,
                                     (ulong)local_46c,uVar16);
                              uVar14 = (ulong)((int)uVar14 + 1);
                            }
                          }
                          local_448 = local_448 + 5;
                        }
                      }
                      else {
                        printf("%10s:info=%d, izero=%d, n=%d, nrhs=%d, imat=%d, nfail=%d\n","cgssvx"
                               ,(ulong)(uint)info,local_430,(ulong)(uint)n,(ulong)local_478);
                        if ((int)uVar10 == -1) {
                          printf("** Estimated memory: %.0f bytes\n",
                                 SUB84((double)mem_usage.total_needed,0));
                          goto LAB_00102625;
                        }
                      }
                      lVar20 = local_300 + 1;
                    }
                    if ((int)uVar10 == 0) {
                      Destroy_SuperNode_Matrix(&L);
                      Destroy_CompCol_Matrix(&U);
                    }
                  }
                  uVar16 = local_438;
                  yVar13 = local_3ec + YES;
                }
                lVar8 = local_308 + 1;
              }
              lVar20 = local_370 + 1;
            }
            Destroy_SuperMatrix_Store(&A);
            Destroy_SuperMatrix_Store(&ASAV);
            StatFree(&stat);
          }
          else {
            local_471 = local_46c - 8 < 0xfffffffd;
            if (((bool)local_471) || ((int)(local_46c - 4) <= n)) {
              local_450 = CONCAT44(local_450._4_4_,local_46c - 8);
              clatb4_slu(main::path,(int *)&local_46c,&n,&n,main::sym,&kl,&ku,&anorm,&mode,&cndnum,
                         main::dist);
              clatms_slu(&n,&n,main::dist,iseed,main::sym,local_378,&mode,&cndnum,&anorm,&kl,&ku,
                         "No packing",local_330,&lda,local_3d0,&info1);
              if (info1 == 0) {
                if ((fact_t)local_450 < 0xfffffffd) {
                  local_430 = (superlu_options_t *)(ulong)(n + 1);
                }
                else {
                  local_430 = (superlu_options_t *)0x1;
                  if (local_46c == 5) {
LAB_00102581:
                    iVar3 = (int)local_430 + -1;
                  }
                  else {
                    if (local_46c == 6) {
                      local_430 = (superlu_options_t *)(ulong)(uint)n;
                      goto LAB_00102581;
                    }
                    iVar3 = n / 2;
                    local_430 = (superlu_options_t *)(ulong)(iVar3 + 1U);
                    if (6 < (int)local_46c) {
                      iVar17 = 0;
                      uVar9 = 0;
                      if (0 < n) {
                        uVar9 = (ulong)(uint)n;
                      }
                      iVar4 = iVar3 * lda;
                      for (; uVar18 = uVar9, iVar1 = iVar4, iVar17 <= (int)(n - (iVar3 + 1U));
                          iVar17 = iVar17 + 1) {
                        while (uVar18 != 0) {
                          local_330[iVar1].r = 0.0;
                          local_330[iVar1].i = 0.0;
                          uVar18 = uVar18 - 1;
                          iVar1 = iVar1 + 1;
                        }
                        iVar4 = iVar4 + lda;
                      }
                      goto LAB_00101b36;
                    }
                  }
                  uVar9 = 0;
                  if (0 < n) {
                    uVar9 = (ulong)(uint)n;
                  }
                  for (uVar18 = 0; uVar9 != uVar18; uVar18 = uVar18 + 1) {
                    local_330[(long)(iVar3 * lda) + uVar18].r = 0.0;
                    local_330[(long)(iVar3 * lda) + uVar18].i = 0.0;
                  }
                }
LAB_00101b36:
                sp_cconvert(n,n,local_330,lda,kl,ku,a,asub,xa,&nnz);
                goto LAB_00101b78;
              }
              printf("%10s:info=%d, izero=%d, n=%d, nrhs=%d, imat=%d, nfail=%d\n","CLATMS",
                     (ulong)(uint)info1,local_430,(ulong)(uint)n,(ulong)local_478,(ulong)local_46c,
                     uVar14);
            }
          }
          local_46c = local_46c + 1;
        } while( true );
      }
    }
  } while( true );
}

Assistant:

int main(int argc, char *argv[])
{
    singlecomplex         *a, *a_save;
    int_t          *asub, *asub_save;
    int_t          *xa, *xa_save;
    SuperMatrix  A, B, X, L, U;
    SuperMatrix  ASAV, AC;
    GlobalLU_t   Glu; /* Not needed on return. */
    mem_usage_t    mem_usage;
    int            *perm_r; /* row permutation from partial pivoting */
    int            *perm_c, *pc_save; /* column permutation */
    int            *etree;
    singlecomplex  zero = {0.0, 0.0};
    float         *R, *C;
    float         *ferr, *berr;
    float         *rwork;
    singlecomplex	   *wwork;
    void           *work = NULL;
    int            nrhs, panel_size, relax;
    int            m, n, info1;
    int_t          nnz, lwork, info;
    singlecomplex         *xact;
    singlecomplex         *rhsb, *solx, *bsav;
    int            ldb, ldx;
    float         rpg, rcond;
    int            i, j, k1;
    float         rowcnd, colcnd, amax;
    int            maxsuper, rowblk, colblk;
    int            prefact, equil, iequed;
    int            nt, nrun, nfail, nerrs, imat, fimat, nimat;
    int            nfact, ifact, itran;
    int            kl, ku, mode, lda, ioff;
    int            zerot; /* indicate whether the matrix is singular */
    int            izero; /* indicate the first column that is entirely zero */
    double         u;
    float         anorm, cndnum;
    singlecomplex         *Afull;
    float         result[NTESTS];
    superlu_options_t options;
    fact_t         fact;
    trans_t        trans;
    SuperLUStat_t  stat;
    static char    matrix_type[8];
    static char    equed[1], path[4], sym[1], dist[1];
    FILE           *fp;

    /* Fixed set of parameters */
    int            iseed[]  = {1988, 1989, 1990, 1991};
    static char    equeds[]  = {'N', 'R', 'C', 'B'};
    static fact_t  facts[] = {FACTORED, DOFACT, SamePattern,
			      SamePattern_SameRowPerm};
    static trans_t transs[]  = {NOTRANS, TRANS, CONJ};

    /* Some function prototypes */ 
    extern int cgst01(int, int, SuperMatrix *, SuperMatrix *, 
		      SuperMatrix *, int *, int *, float *);
    extern int cgst02(trans_t, int, int, int, SuperMatrix *, singlecomplex *,
                      int, singlecomplex *, int, float *resid);
    extern int cgst04(int, int, singlecomplex *, int, 
                      singlecomplex *, int, float rcond, float *resid);
    extern int cgst07(trans_t, int, int, SuperMatrix *, singlecomplex *, int,
                         singlecomplex *, int, singlecomplex *, int, 
                         float *, float *, float *);
    extern int clatb4_slu(char *, int *, int *, int *, char *, int *, int *, 
	               float *, int *, float *, char *);
    extern int clatms_slu(int *, int *, char *, int *, char *, float *d,
                       int *, float *, float *, int *, int *,
                       char *, singlecomplex *, int *, singlecomplex *, int *);
    extern int sp_cconvert(int, int, singlecomplex *, int, int, int,
	                   singlecomplex *a, int_t *, int_t *, int_t *);


    /* Executable statements */

    strcpy(path, "CGE");
    nrun  = 0;
    nfail = 0;
    nerrs = 0;

    /* Defaults */
    lwork      = 0;
    n          = 1;
    nrhs       = 1;
    panel_size = sp_ienv(1);
    relax      = sp_ienv(2);
    u          = 1.0;
    strcpy(matrix_type, "LA");
    parse_command_line(argc, argv, matrix_type, &n,
		       &panel_size, &relax, &nrhs, &maxsuper,
		       &rowblk, &colblk, &lwork, &u, &fp);
    if ( lwork > 0 ) {
	work = SUPERLU_MALLOC(lwork);
	if ( !work ) {
	    fprintf(stderr, "expert: cannot allocate %lld bytes\n", (long long) lwork);
	    exit (-1);
	}
    }

    /* Set the default input options. */
    set_default_options(&options);
    options.DiagPivotThresh = u;
    options.PrintStat = NO;
    options.PivotGrowth = YES;
    options.ConditionNumber = YES;
    options.IterRefine = SLU_SINGLE;
    
    if ( strcmp(matrix_type, "LA") == 0 ) {
	/* Test LAPACK matrix suite. */
	m = n;
	lda = SUPERLU_MAX(n, 1);
	nnz = n * n;        /* upper bound */
	fimat = 1;
	nimat = NTYPES;
	Afull = singlecomplexCalloc(lda * n);
	callocateA(n, nnz, &a, &asub, &xa);
    } else {
	/* Read a sparse matrix */
	fimat = nimat = 0;
	creadhb(fp, &m, &n, &nnz, &a, &asub, &xa);
    }

    callocateA(n, nnz, &a_save, &asub_save, &xa_save);
    rhsb = singlecomplexMalloc(m * nrhs);
    bsav = singlecomplexMalloc(m * nrhs);
    solx = singlecomplexMalloc(n * nrhs);
    xact = singlecomplexMalloc(n * nrhs);
    wwork = singlecomplexCalloc( SUPERLU_MAX(m,n) * SUPERLU_MAX(4,nrhs) );

    ldb  = m;
    ldx  = n;
    cCreate_Dense_Matrix(&B, m, nrhs, rhsb, ldb, SLU_DN, SLU_C, SLU_GE);
    cCreate_Dense_Matrix(&X, n, nrhs, solx, ldx, SLU_DN, SLU_C, SLU_GE);
    etree   = int32Malloc(n);
    perm_r  = int32Malloc(n);
    perm_c  = int32Malloc(n);
    pc_save = int32Malloc(n);
    R       = (float *) SUPERLU_MALLOC(m*sizeof(float));
    C       = (float *) SUPERLU_MALLOC(n*sizeof(float));
    ferr    = (float *) SUPERLU_MALLOC(nrhs*sizeof(float));
    berr    = (float *) SUPERLU_MALLOC(nrhs*sizeof(float));
    j = SUPERLU_MAX(m,n) * SUPERLU_MAX(4,nrhs);    
    rwork   = (float *) SUPERLU_MALLOC(j*sizeof(float));
    for (i = 0; i < j; ++i) rwork[i] = 0.;
    if ( !R ) ABORT("SUPERLU_MALLOC fails for R");
    if ( !C ) ABORT("SUPERLU_MALLOC fails for C");
    if ( !ferr ) ABORT("SUPERLU_MALLOC fails for ferr");
    if ( !berr ) ABORT("SUPERLU_MALLOC fails for berr");
    if ( !rwork ) ABORT("SUPERLU_MALLOC fails for rwork");

    for (i = 0; i < n; ++i) perm_c[i] = pc_save[i] = i;
    options.ColPerm = MY_PERMC;

    for (imat = fimat; imat <= nimat; ++imat) { /* All matrix types */
	
	if ( imat ) {

	    /* Skip types 5, 6, or 7 if the matrix size is too small. */
	    zerot = (imat >= 5 && imat <= 7);
	    if ( zerot && n < imat-4 )
		continue;
	    
	    /* Set up parameters with CLATB4 and generate a test matrix
	       with CLATMS.  */
	    clatb4_slu(path, &imat, &n, &n, sym, &kl, &ku, &anorm, &mode,
		    &cndnum, dist);

	    clatms_slu(&n, &n, dist, iseed, sym, &rwork[0], &mode, &cndnum,
		    &anorm, &kl, &ku, "No packing", Afull, &lda,
		    &wwork[0], &info1);

	    if ( info1 ) {
		printf(FMT3, "CLATMS", info1, izero, n, nrhs, imat, nfail);
		continue;
	    }

	    /* For types 5-7, zero one or more columns of the matrix
	       to test that INFO is returned correctly.   */
	    if ( zerot ) {
		if ( imat == 5 ) izero = 1;
		else if ( imat == 6 ) izero = n;
		else izero = n / 2 + 1;
		ioff = (izero - 1) * lda;
		if ( imat < 7 ) {
		    for (i = 0; i < n; ++i) Afull[ioff + i] = zero;
		} else {
		    for (j = 0; j < n - izero + 1; ++j)
			for (i = 0; i < n; ++i)
			    Afull[ioff + i + j*lda] = zero;
		}
	    } else {
		izero = n+1; /* none of the column is zero */
	    }

	    /* Convert to sparse representation. */
	    sp_cconvert(n, n, Afull, lda, kl, ku, a, asub, xa, &nnz);

	} else {
	    izero = n+1; /* none of the column is zero */
	    zerot = 0;
	}
	
	cCreate_CompCol_Matrix(&A, m, n, nnz, a, asub, xa, SLU_NC, SLU_C, SLU_GE);

	/* Save a copy of matrix A in ASAV */
	cCreate_CompCol_Matrix(&ASAV, m, n, nnz, a_save, asub_save, xa_save,
			      SLU_NC, SLU_C, SLU_GE);
	cCopy_CompCol_Matrix(&A, &ASAV);
	
	/* Form exact solution. */
	cGenXtrue(n, nrhs, xact, ldx);
	
	StatInit(&stat);

	for (iequed = 0; iequed < 4; ++iequed) {
	    *equed = equeds[iequed];
	    if (iequed == 0) nfact = 4;
	    else nfact = 1; /* Only test factored, pre-equilibrated matrix */

	    for (ifact = 0; ifact < nfact; ++ifact) {
		fact = facts[ifact];
		options.Fact = fact;

		for (equil = 0; equil < 2; ++equil) {
		    options.Equil = equil;
		    prefact   = ( options.Fact == FACTORED ||
				  options.Fact == SamePattern_SameRowPerm );
                                /* Need a first factor */

		    /* Restore the matrix A. */
		    cCopy_CompCol_Matrix(&ASAV, &A);
			
		    if ( zerot ) {
                        if ( prefact ) continue;
		    } else if ( options.Fact == FACTORED ) {
                        if ( equil || iequed ) {
			    /* Compute row and column scale factors to
			       equilibrate matrix A.    */
			    cgsequ(&A, R, C, &rowcnd, &colcnd, &amax, &info1);

			    /* Force equilibration. */
			    if ( !info && n > 0 ) {
				if ( strncmp(equed, "R", 1)==0 ) {
				    rowcnd = 0.;
				    colcnd = 1.;
				} else if ( strncmp(equed, "C", 1)==0 ) {
				    rowcnd = 1.;
				    colcnd = 0.;
				} else if ( strncmp(equed, "B", 1)==0 ) {
				    rowcnd = 0.;
				    colcnd = 0.;
				}
			    }
			
			    /* Equilibrate the matrix. */
			    claqgs(&A, R, C, rowcnd, colcnd, amax, equed);
			}
		    }
		    
		    if ( prefact ) { /* Need a factor for the first time */
			
		        /* Save Fact option. */
		        fact = options.Fact;
			options.Fact = DOFACT;

			/* Preorder the matrix, obtain the column etree. */
			sp_preorder(&options, &A, perm_c, etree, &AC);

			/* Factor the matrix AC. */
			cgstrf(&options, &AC, relax, panel_size,
                               etree, work, lwork, perm_c, perm_r, &L, &U,
                               &Glu, &stat, &info);

			if ( info ) { 
                            printf("** First factor: info %lld, equed %c\n",
				   (long long) info, *equed);
                            if ( lwork == -1 ) {
                                printf("** Estimated memory: %lld bytes\n",
                                        (long long) info - n);
                                exit(0);
                            }
                        }
	
                        Destroy_CompCol_Permuted(&AC);
			
		        /* Restore Fact option. */
			options.Fact = fact;
		    } /* if .. first time factor */
		    
		    for (itran = 0; itran < NTRAN; ++itran) {
			trans = transs[itran];
                        options.Trans = trans;

			/* Restore the matrix A. */
			cCopy_CompCol_Matrix(&ASAV, &A);
			
 			/* Set the right hand side. */
			cFillRHS(trans, nrhs, xact, ldx, &A, &B);
			cCopy_Dense_Matrix(m, nrhs, rhsb, ldb, bsav, ldb);

			/*----------------
			 * Test cgssv
			 *----------------*/
			if ( options.Fact == DOFACT && itran == 0) {
                            /* Not yet factored, and untransposed */
	
			    cCopy_Dense_Matrix(m, nrhs, rhsb, ldb, solx, ldx);
			    cgssv(&options, &A, perm_c, perm_r, &L, &U, &X,
                                  &stat, &info);
			    
			    if ( info && info != izero ) {
                                printf(FMT3, "cgssv",
				       (int) info, izero, n, nrhs, imat, nfail);
			    } else {
                                /* Reconstruct matrix from factors and compute residual.
				 * Only compute the leading 'izero' nonzero columns.
				 */
                                cgst01(m, izero-1, &A, &L, &U, perm_c, perm_r,
                                         &result[0]);
				nt = 1;
				if ( izero == (n+1) ) {
				    /* Compute residual of the computed
				       solution. */
				    cCopy_Dense_Matrix(m, nrhs, rhsb, ldb,
						       wwork, ldb);
				    cgst02(trans, m, n, nrhs, &A, solx,
                                              ldx, wwork,ldb, &result[1]);
				    nt = 2;
				}
				
				/* Print information about the tests that
				   did not pass the threshold.      */
				for (i = 0; i < nt; ++i) {
				    if ( result[i] >= THRESH ) {
					printf(FMT1, "cgssv", n, i,
					       result[i]);
					++nfail;
				    }
				}
				nrun += nt;
			    } /* else .. info == 0 */

			    /* Restore perm_c. */
			    for (i = 0; i < n; ++i) perm_c[i] = pc_save[i];

		            if (lwork == 0) {
			        Destroy_SuperNode_Matrix(&L);
			        Destroy_CompCol_Matrix(&U);
			    }
			} /* if .. end of testing cgssv */
    
			/*----------------
			 * Test cgssvx
			 *----------------*/
    
			/* Equilibrate the matrix if fact = FACTORED and
			   equed = 'R', 'C', or 'B'.   */
			if ( options.Fact == FACTORED &&
			     (equil || iequed) && n > 0 ) {
			    claqgs(&A, R, C, rowcnd, colcnd, amax, equed);
			}
			
			/* Solve the system and compute the condition number
			   and error bounds using cgssvx.      */
			cgssvx(&options, &A, perm_c, perm_r, etree,
                               equed, R, C, &L, &U, work, lwork, &B, &X, &rpg,
                               &rcond, ferr, berr, &Glu,
			       &mem_usage, &stat, &info);

			if ( info && info != izero ) {
			    printf(FMT3, "cgssvx",
				   (int) info, izero, n, nrhs, imat, nfail);
                            if ( lwork == -1 ) {
                                printf("** Estimated memory: %.0f bytes\n",
                                        mem_usage.total_needed);
                                exit(0);
                            }
			} else {
			    if ( !prefact ) {
			    	/* Reconstruct matrix from factors and compute residual.
				 * Only compute the leading 'izero' nonzero columns.
				 */
                                cgst01(m, izero-1, &A, &L, &U, perm_c, perm_r,
                                         &result[0]);
				k1 = 0;
			    } else {
			   	k1 = 1;
			    }

			    if ( !info ) {
				/* Compute residual of the computed solution.*/
				cCopy_Dense_Matrix(m, nrhs, bsav, ldb,
						  wwork, ldb);
				cgst02(trans, m, n, nrhs, &ASAV, solx, ldx,
					  wwork, ldb, &result[1]);

				/* Check solution from generated exact
				   solution. */
				cgst04(n, nrhs, solx, ldx, xact, ldx, rcond,
					  &result[2]);

				/* Check the error bounds from iterative
				   refinement. */
				cgst07(trans, n, nrhs, &ASAV, bsav, ldb,
					  solx, ldx, xact, ldx, ferr, berr,
					  &result[3]);

				/* Print information about the tests that did
				   not pass the threshold.    */
				for (i = k1; i < NTESTS; ++i) {
				    if ( result[i] >= THRESH ) {
					printf(FMT2, "cgssvx",
					       options.Fact, trans, *equed,
					       n, imat, i, result[i]);
					++nfail;
				    }
				}
				nrun += NTESTS;
			    } /* if .. info == 0 */
			} /* else .. end of testing cgssvx */

		    } /* for itran ... */

		    if ( lwork == 0 ) {
			Destroy_SuperNode_Matrix(&L);
			Destroy_CompCol_Matrix(&U);
		    }

		} /* for equil ... */
	    } /* for ifact ... */
	} /* for iequed ... */
#if 0    
    if ( !info ) {
	PrintPerf(&L, &U, &mem_usage, rpg, rcond, ferr, berr, equed);
    }
#endif
        Destroy_SuperMatrix_Store(&A);
        Destroy_SuperMatrix_Store(&ASAV);
        StatFree(&stat);

    } /* for imat ... */

    /* Print a summary of the results. */
    PrintSumm("CGE", nfail, nrun, nerrs);

    if ( strcmp(matrix_type, "LA") == 0 ) SUPERLU_FREE (Afull);
    SUPERLU_FREE (rhsb);
    SUPERLU_FREE (bsav);
    SUPERLU_FREE (solx);    
    SUPERLU_FREE (xact);
    SUPERLU_FREE (etree);
    SUPERLU_FREE (perm_r);
    SUPERLU_FREE (perm_c);
    SUPERLU_FREE (pc_save);
    SUPERLU_FREE (R);
    SUPERLU_FREE (C);
    SUPERLU_FREE (ferr);
    SUPERLU_FREE (berr);
    SUPERLU_FREE (rwork);
    SUPERLU_FREE (wwork);
    Destroy_SuperMatrix_Store(&B);
    Destroy_SuperMatrix_Store(&X);
#if 0
    Destroy_CompCol_Matrix(&A);
    Destroy_CompCol_Matrix(&ASAV);
#else
    SUPERLU_FREE(a); SUPERLU_FREE(asub); SUPERLU_FREE(xa);
    SUPERLU_FREE(a_save); SUPERLU_FREE(asub_save); SUPERLU_FREE(xa_save);
#endif
    if ( lwork > 0 ) {
	SUPERLU_FREE (work);
	Destroy_SuperMatrix_Store(&L);
	Destroy_SuperMatrix_Store(&U);
    }

    return (nfail == 0) ? EXIT_SUCCESS : EXIT_FAILURE;
}